

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_sse2.c
# Opt level: O1

void PredictorAdd12_SSE2(uint32_t *in,uint32_t *upper,int num_pixels,uint32_t *out)

{
  uint32_t *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint32_t uVar4;
  char cVar5;
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  char cVar40;
  undefined1 auVar41 [15];
  unkuint9 Var42;
  undefined1 auVar43 [11];
  undefined1 auVar44 [15];
  unkuint9 Var45;
  undefined1 auVar46 [11];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  ushort uVar53;
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined3 uVar60;
  undefined8 uVar61;
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  uint uVar66;
  undefined5 uVar67;
  undefined1 auVar68 [12];
  undefined8 uVar69;
  undefined1 auVar70 [12];
  undefined1 auVar71 [12];
  undefined1 auVar72 [12];
  undefined1 auVar73 [14];
  undefined8 uVar74;
  undefined1 auVar75 [14];
  undefined1 auVar76 [14];
  undefined1 auVar77 [14];
  int iVar78;
  ulong uVar79;
  ulong uVar80;
  ulong uVar81;
  byte bVar82;
  ushort uVar83;
  short sVar84;
  char cVar87;
  char cVar88;
  short sVar89;
  char cVar91;
  char cVar92;
  short sVar93;
  char cVar94;
  char cVar95;
  short sVar96;
  byte bVar97;
  short sVar98;
  short sVar99;
  short sVar100;
  undefined1 auVar90 [14];
  short sVar101;
  undefined4 uVar102;
  short sVar106;
  short sVar107;
  short sVar108;
  short sVar109;
  undefined4 uVar110;
  undefined4 uVar111;
  char cVar115;
  short sVar116;
  short sVar117;
  short sVar118;
  short sVar119;
  undefined2 uVar85;
  undefined4 uVar86;
  char cVar103;
  char cVar104;
  char cVar105;
  char cVar112;
  char cVar113;
  char cVar114;
  
  uVar81 = 0;
  if (3 < num_pixels) {
    uVar4 = out[-1];
    uVar83 = (ushort)uVar4;
    auVar90._6_8_ = 0;
    auVar90._0_6_ =
         (uint6)(uint5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)(uVar4 >> 0x18
                                                                                      ) << 0x30) >>
                                                                       0x28),
                                                                CONCAT14((char)(uVar4 >> 0x10),uVar4
                                                                        )) >> 0x20),uVar4) >> 0x18),
                                 CONCAT12((char)(uVar4 >> 8),uVar83)) >> 0x10) & 0xffff00ff00ff;
    uVar80 = 0;
    do {
      puVar1 = in + uVar80;
      cVar5 = (char)puVar1[2];
      cVar112 = *(char *)((long)puVar1 + 9);
      cVar113 = *(char *)((long)puVar1 + 10);
      cVar114 = *(char *)((long)puVar1 + 0xb);
      cVar40 = (char)puVar1[3];
      cVar103 = *(char *)((long)puVar1 + 0xd);
      cVar104 = *(char *)((long)puVar1 + 0xe);
      cVar105 = *(char *)((long)puVar1 + 0xf);
      auVar2 = *(undefined1 (*) [16])(upper + (uVar80 - 1));
      auVar3 = *(undefined1 (*) [16])(upper + uVar80);
      auVar6[0xd] = 0;
      auVar6._0_13_ = auVar3._0_13_;
      auVar6[0xe] = auVar3[7];
      auVar12[0xc] = auVar3[6];
      auVar12._0_12_ = auVar3._0_12_;
      auVar12._13_2_ = auVar6._13_2_;
      auVar14[0xb] = 0;
      auVar14._0_11_ = auVar3._0_11_;
      auVar14._12_3_ = auVar12._12_3_;
      auVar20[10] = auVar3[5];
      auVar20._0_10_ = auVar3._0_10_;
      auVar20._11_4_ = auVar14._11_4_;
      auVar22[9] = 0;
      auVar22._0_9_ = auVar3._0_9_;
      auVar22._10_5_ = auVar20._10_5_;
      auVar28[8] = auVar3[4];
      auVar28._0_8_ = auVar3._0_8_;
      auVar28._9_6_ = auVar22._9_6_;
      auVar41._7_8_ = 0;
      auVar41._0_7_ = auVar28._8_7_;
      Var42 = CONCAT81(SUB158(auVar41 << 0x40,7),auVar3[3]);
      auVar56._9_6_ = 0;
      auVar56._0_9_ = Var42;
      auVar43._1_10_ = SUB1510(auVar56 << 0x30,5);
      auVar43[0] = auVar3[2];
      auVar57._11_4_ = 0;
      auVar57._0_11_ = auVar43;
      auVar34[2] = auVar3[1];
      auVar34._0_2_ = auVar3._0_2_;
      auVar34._3_12_ = SUB1512(auVar57 << 0x20,3);
      auVar7[0xd] = 0;
      auVar7._0_13_ = auVar2._0_13_;
      auVar7[0xe] = auVar2[7];
      auVar13[0xc] = auVar2[6];
      auVar13._0_12_ = auVar2._0_12_;
      auVar13._13_2_ = auVar7._13_2_;
      auVar15[0xb] = 0;
      auVar15._0_11_ = auVar2._0_11_;
      auVar15._12_3_ = auVar13._12_3_;
      auVar21[10] = auVar2[5];
      auVar21._0_10_ = auVar2._0_10_;
      auVar21._11_4_ = auVar15._11_4_;
      auVar23[9] = 0;
      auVar23._0_9_ = auVar2._0_9_;
      auVar23._10_5_ = auVar21._10_5_;
      auVar29[8] = auVar2[4];
      auVar29._0_8_ = auVar2._0_8_;
      auVar29._9_6_ = auVar23._9_6_;
      auVar44._7_8_ = 0;
      auVar44._0_7_ = auVar29._8_7_;
      Var45 = CONCAT81(SUB158(auVar44 << 0x40,7),auVar2[3]);
      auVar58._9_6_ = 0;
      auVar58._0_9_ = Var45;
      auVar46._1_10_ = SUB1510(auVar58 << 0x30,5);
      auVar46[0] = auVar2[2];
      auVar59._11_4_ = 0;
      auVar59._0_11_ = auVar46;
      auVar35[2] = auVar2[1];
      auVar35._0_2_ = auVar2._0_2_;
      auVar35._3_12_ = SUB1512(auVar59 << 0x20,3);
      sVar116 = auVar28._8_2_ - auVar29._8_2_;
      sVar117 = auVar20._10_2_ - auVar21._10_2_;
      sVar118 = auVar12._12_2_ - auVar13._12_2_;
      sVar119 = (auVar6._13_2_ >> 8) - (auVar7._13_2_ >> 8);
      sVar106 = (ushort)auVar3[0xc] - (ushort)auVar2[0xc];
      sVar107 = (ushort)auVar3[0xd] - (ushort)auVar2[0xd];
      sVar108 = (ushort)auVar3[0xe] - (ushort)auVar2[0xe];
      sVar109 = (ushort)auVar3[0xf] - (ushort)auVar2[0xf];
      sVar84 = (uVar83 & 0xff) + ((auVar3._0_2_ & 0xff) - (auVar2._0_2_ & 0xff));
      sVar89 = auVar90._0_2_ + (auVar34._2_2_ - auVar35._2_2_);
      sVar93 = auVar90._2_2_ + (auVar43._0_2_ - auVar46._0_2_);
      sVar96 = auVar90._4_2_ + ((short)Var42 - (short)Var45);
      sVar98 = auVar90._6_2_ + sVar116;
      sVar99 = auVar90._8_2_ + sVar117;
      sVar100 = auVar90._10_2_ + sVar118;
      sVar101 = auVar90._12_2_ + sVar119;
      bVar82 = ((0 < sVar84) * (sVar84 < 0x100) * (char)sVar84 - (0xff < sVar84)) + (char)*puVar1;
      cVar87 = ((0 < sVar89) * (sVar89 < 0x100) * (char)sVar89 - (0xff < sVar89)) +
               *(char *)((long)puVar1 + 1);
      uVar85 = CONCAT11(cVar87,bVar82);
      cVar88 = ((0 < sVar93) * (sVar93 < 0x100) * (char)sVar93 - (0xff < sVar93)) +
               *(char *)((long)puVar1 + 2);
      cVar91 = ((0 < sVar96) * (sVar96 < 0x100) * (char)sVar96 - (0xff < sVar96)) +
               *(char *)((long)puVar1 + 3);
      uVar86 = CONCAT13(cVar91,CONCAT12(cVar88,uVar85));
      cVar92 = ((0 < sVar98) * (sVar98 < 0x100) * (char)sVar98 - (0xff < sVar98)) + (char)puVar1[1];
      cVar94 = ((0 < sVar99) * (sVar99 < 0x100) * (char)sVar99 - (0xff < sVar99)) +
               *(char *)((long)puVar1 + 5);
      cVar95 = ((0 < sVar100) * (sVar100 < 0x100) * (char)sVar100 - (0xff < sVar100)) +
               *(char *)((long)puVar1 + 6);
      bVar97 = ((0 < sVar101) * (sVar101 < 0x100) * (char)sVar101 - (0xff < sVar101)) +
               *(char *)((long)puVar1 + 7);
      uVar83 = CONCAT11(((0 < sVar84) * (sVar84 < 0x100) * (char)sVar84 - (0xff < sVar84)) + cVar5,
                        bVar97);
      uVar60 = CONCAT12(((0 < sVar89) * (sVar89 < 0x100) * (char)sVar89 - (0xff < sVar89)) + cVar112
                        ,uVar83);
      uVar66 = CONCAT13(((0 < sVar93) * (sVar93 < 0x100) * (char)sVar93 - (0xff < sVar93)) + cVar113
                        ,uVar60);
      uVar67 = CONCAT14(((0 < sVar96) * (sVar96 < 0x100) * (char)sVar96 - (0xff < sVar96)) + cVar114
                        ,uVar66);
      auVar73[5] = ((0 < sVar98) * (sVar98 < 0x100) * (char)sVar98 - (0xff < sVar98)) + cVar40;
      auVar73._0_5_ = uVar67;
      auVar73._6_8_ = 0;
      auVar8[0xe] = bVar97;
      auVar8._0_14_ = auVar73 << 0x38;
      uVar74 = CONCAT26(auVar8._13_2_,CONCAT15(cVar95,uVar67));
      auVar68._4_8_ = 0;
      auVar68._0_4_ = uVar66;
      auVar16._12_3_ = (int3)((ulong)uVar74 >> 0x28);
      auVar16._0_12_ = auVar68 << 0x38;
      uVar69 = CONCAT44(auVar16._11_4_,CONCAT13(cVar94,uVar60));
      auVar24._10_5_ = (int5)((ulong)uVar69 >> 0x18);
      auVar24._0_10_ = (unkuint10)uVar83 << 0x38;
      uVar61 = CONCAT62(auVar24._9_6_,CONCAT11(cVar92,bVar97));
      auVar47._7_8_ = 0;
      auVar47._0_7_ = (uint7)((ulong)uVar61 >> 8);
      Var42 = CONCAT81(SUB158(auVar47 << 0x40,7),cVar91);
      auVar62._9_6_ = 0;
      auVar62._0_9_ = Var42;
      auVar30[4] = cVar88;
      auVar30._0_4_ = uVar86;
      auVar30._5_10_ = SUB1510(auVar62 << 0x30,5);
      auVar48._11_4_ = 0;
      auVar48._0_11_ = auVar30._4_11_;
      auVar36[2] = cVar87;
      auVar36._0_2_ = uVar85;
      auVar36._3_12_ = SUB1512(auVar48 << 0x20,3);
      sVar116 = sVar116 + (ushort)bVar82;
      sVar117 = sVar117 + auVar36._2_2_;
      sVar118 = sVar118 + auVar30._4_2_;
      sVar119 = sVar119 + (short)Var42;
      sVar84 = (short)((ulong)uVar61 >> 8);
      sVar89 = (short)((ulong)uVar69 >> 0x18);
      sVar93 = (short)((ulong)uVar74 >> 0x28);
      bVar82 = ((0 < sVar116) * (sVar116 < 0x100) * (char)sVar116 - (0xff < sVar116)) +
               (char)puVar1[1];
      cVar87 = ((0 < sVar117) * (sVar117 < 0x100) * (char)sVar117 - (0xff < sVar117)) +
               *(char *)((long)puVar1 + 5);
      uVar85 = CONCAT11(cVar87,bVar82);
      cVar88 = ((0 < sVar118) * (sVar118 < 0x100) * (char)sVar118 - (0xff < sVar118)) +
               *(char *)((long)puVar1 + 6);
      cVar91 = ((0 < sVar119) * (sVar119 < 0x100) * (char)sVar119 - (0xff < sVar119)) +
               *(char *)((long)puVar1 + 7);
      uVar110 = CONCAT13(cVar91,CONCAT12(cVar88,uVar85));
      cVar115 = ((bVar97 != 0) * (bVar97 < 0x100) * bVar97 - (0xff < bVar97)) + cVar114;
      uVar83 = CONCAT11(((0 < sVar116) * (sVar116 < 0x100) * (char)sVar116 - (0xff < sVar116)) +
                        cVar40,cVar115);
      uVar60 = CONCAT12(((0 < sVar117) * (sVar117 < 0x100) * (char)sVar117 - (0xff < sVar117)) +
                        cVar103,uVar83);
      uVar66 = CONCAT13(((0 < sVar118) * (sVar118 < 0x100) * (char)sVar118 - (0xff < sVar118)) +
                        cVar104,uVar60);
      uVar67 = CONCAT14(((0 < sVar119) * (sVar119 < 0x100) * (char)sVar119 - (0xff < sVar119)) +
                        cVar105,uVar66);
      auVar75[5] = (0 < sVar84) * (sVar84 < 0x100) * cVar92 - (0xff < sVar84);
      auVar75._0_5_ = uVar67;
      auVar75._6_8_ = 0;
      auVar9[0xe] = cVar115;
      auVar9._0_14_ = auVar75 << 0x38;
      uVar74 = CONCAT26(auVar9._13_2_,
                        CONCAT15(((0 < sVar93) * (sVar93 < 0x100) * cVar95 - (0xff < sVar93)) +
                                 cVar113,uVar67));
      auVar70._4_8_ = 0;
      auVar70._0_4_ = uVar66;
      auVar17._12_3_ = (int3)((ulong)uVar74 >> 0x28);
      auVar17._0_12_ = auVar70 << 0x38;
      uVar69 = CONCAT44(auVar17._11_4_,
                        CONCAT13(((0 < sVar89) * (sVar89 < 0x100) * cVar94 - (0xff < sVar89)) +
                                 cVar112,uVar60));
      auVar25._10_5_ = (int5)((ulong)uVar69 >> 0x18);
      auVar25._0_10_ = (unkuint10)uVar83 << 0x38;
      uVar61 = CONCAT62(auVar25._9_6_,
                        CONCAT11(((0 < sVar84) * (sVar84 < 0x100) * cVar92 - (0xff < sVar84)) +
                                 cVar5,cVar115));
      auVar49._7_8_ = 0;
      auVar49._0_7_ = (uint7)((ulong)uVar61 >> 8);
      Var42 = CONCAT81(SUB158(auVar49 << 0x40,7),cVar91);
      auVar63._9_6_ = 0;
      auVar63._0_9_ = Var42;
      auVar31[4] = cVar88;
      auVar31._0_4_ = uVar110;
      auVar31._5_10_ = SUB1510(auVar63 << 0x30,5);
      auVar50._11_4_ = 0;
      auVar50._0_11_ = auVar31._4_11_;
      auVar37[2] = cVar87;
      auVar37._0_2_ = uVar85;
      auVar37._3_12_ = SUB1512(auVar50 << 0x20,3);
      sVar84 = (ushort)bVar82 + ((ushort)auVar3[8] - (ushort)auVar2[8]);
      sVar89 = auVar37._2_2_ + ((ushort)auVar3[9] - (ushort)auVar2[9]);
      sVar93 = auVar31._4_2_ + ((ushort)auVar3[10] - (ushort)auVar2[10]);
      sVar96 = (short)Var42 + ((ushort)auVar3[0xb] - (ushort)auVar2[0xb]);
      sVar98 = (short)((ulong)uVar61 >> 8) + sVar106;
      sVar99 = (short)((ulong)uVar69 >> 0x18) + sVar107;
      sVar100 = (short)((ulong)uVar74 >> 0x28) + sVar108;
      sVar101 = (auVar9._13_2_ >> 8) + sVar109;
      bVar82 = ((0 < sVar84) * (sVar84 < 0x100) * (char)sVar84 - (0xff < sVar84)) + cVar5;
      cVar112 = ((0 < sVar89) * (sVar89 < 0x100) * (char)sVar89 - (0xff < sVar89)) + cVar112;
      uVar85 = CONCAT11(cVar112,bVar82);
      cVar113 = ((0 < sVar93) * (sVar93 < 0x100) * (char)sVar93 - (0xff < sVar93)) + cVar113;
      cVar114 = ((0 < sVar96) * (sVar96 < 0x100) * (char)sVar96 - (0xff < sVar96)) + cVar114;
      uVar111 = CONCAT13(cVar114,CONCAT12(cVar113,uVar85));
      cVar87 = ((0 < sVar98) * (sVar98 < 0x100) * (char)sVar98 - (0xff < sVar98)) + cVar40;
      cVar88 = ((0 < sVar99) * (sVar99 < 0x100) * (char)sVar99 - (0xff < sVar99)) + cVar103;
      cVar91 = ((0 < sVar100) * (sVar100 < 0x100) * (char)sVar100 - (0xff < sVar100)) + cVar104;
      bVar97 = ((0 < sVar101) * (sVar101 < 0x100) * (char)sVar101 - (0xff < sVar101)) + cVar105;
      uVar83 = CONCAT11((0 < sVar84) * (sVar84 < 0x100) * (char)sVar84 - (0xff < sVar84),bVar97);
      uVar60 = CONCAT12((0 < sVar89) * (sVar89 < 0x100) * (char)sVar89 - (0xff < sVar89),uVar83);
      uVar66 = CONCAT13((0 < sVar93) * (sVar93 < 0x100) * (char)sVar93 - (0xff < sVar93),uVar60);
      uVar67 = CONCAT14((0 < sVar96) * (sVar96 < 0x100) * (char)sVar96 - (0xff < sVar96),uVar66);
      auVar76[5] = (0 < sVar98) * (sVar98 < 0x100) * (char)sVar98 - (0xff < sVar98);
      auVar76._0_5_ = uVar67;
      auVar76._6_8_ = 0;
      auVar10[0xe] = bVar97;
      auVar10._0_14_ = auVar76 << 0x38;
      uVar74 = CONCAT26(auVar10._13_2_,CONCAT15(cVar91,uVar67));
      auVar71._4_8_ = 0;
      auVar71._0_4_ = uVar66;
      auVar18._12_3_ = (int3)((ulong)uVar74 >> 0x28);
      auVar18._0_12_ = auVar71 << 0x38;
      uVar69 = CONCAT44(auVar18._11_4_,CONCAT13(cVar88,uVar60));
      auVar26._10_5_ = (int5)((ulong)uVar69 >> 0x18);
      auVar26._0_10_ = (unkuint10)uVar83 << 0x38;
      uVar61 = CONCAT62(auVar26._9_6_,CONCAT11(cVar87,bVar97));
      auVar51._7_8_ = 0;
      auVar51._0_7_ = (uint7)((ulong)uVar61 >> 8);
      Var42 = CONCAT81(SUB158(auVar51 << 0x40,7),cVar114);
      auVar64._9_6_ = 0;
      auVar64._0_9_ = Var42;
      auVar32[4] = cVar113;
      auVar32._0_4_ = uVar111;
      auVar32._5_10_ = SUB1510(auVar64 << 0x30,5);
      auVar52._11_4_ = 0;
      auVar52._0_11_ = auVar32._4_11_;
      auVar38[2] = cVar112;
      auVar38._0_2_ = uVar85;
      auVar38._3_12_ = SUB1512(auVar52 << 0x20,3);
      sVar106 = sVar106 + (ushort)bVar82;
      sVar107 = sVar107 + auVar38._2_2_;
      sVar108 = sVar108 + auVar32._4_2_;
      sVar109 = sVar109 + (short)Var42;
      sVar84 = (short)((ulong)uVar61 >> 8);
      sVar89 = (short)((ulong)uVar69 >> 0x18);
      sVar93 = (short)((ulong)uVar74 >> 0x28);
      cVar5 = (bVar97 != 0) * (bVar97 < 0x100) * bVar97 - (0xff < bVar97);
      cVar103 = ((0 < sVar107) * (sVar107 < 0x100) * (char)sVar107 - (0xff < sVar107)) + cVar103;
      uVar83 = CONCAT11(cVar103,((0 < sVar106) * (sVar106 < 0x100) * (char)sVar106 -
                                (0xff < sVar106)) + cVar40);
      cVar104 = ((0 < sVar108) * (sVar108 < 0x100) * (char)sVar108 - (0xff < sVar108)) + cVar104;
      cVar105 = ((0 < sVar109) * (sVar109 < 0x100) * (char)sVar109 - (0xff < sVar109)) + cVar105;
      uVar102 = CONCAT13(cVar105,CONCAT12(cVar104,uVar83));
      uVar53 = CONCAT11((0 < sVar106) * (sVar106 < 0x100) * (char)sVar106 - (0xff < sVar106),cVar5);
      uVar60 = CONCAT12((0 < sVar107) * (sVar107 < 0x100) * (char)sVar107 - (0xff < sVar107),uVar53)
      ;
      uVar66 = CONCAT13((0 < sVar108) * (sVar108 < 0x100) * (char)sVar108 - (0xff < sVar108),uVar60)
      ;
      uVar67 = CONCAT14((0 < sVar109) * (sVar109 < 0x100) * (char)sVar109 - (0xff < sVar109),uVar66)
      ;
      auVar77[5] = (0 < sVar84) * (sVar84 < 0x100) * cVar87 - (0xff < sVar84);
      auVar77._0_5_ = uVar67;
      *(ulong *)(out + uVar80) = CONCAT44(uVar110,uVar86);
      *(ulong *)(out + uVar80 + 2) = CONCAT44(uVar102,uVar111);
      auVar77._6_8_ = 0;
      auVar11[0xe] = cVar5;
      auVar11._0_14_ = auVar77 << 0x38;
      auVar72._4_8_ = 0;
      auVar72._0_4_ = uVar66;
      auVar19._12_3_ =
           (int3)(CONCAT26(auVar11._13_2_,
                           CONCAT15((0 < sVar93) * (sVar93 < 0x100) * cVar91 - (0xff < sVar93),
                                    uVar67)) >> 0x28);
      auVar19._0_12_ = auVar72 << 0x38;
      auVar27._10_5_ =
           (int5)(CONCAT44(auVar19._11_4_,
                           CONCAT13((0 < sVar89) * (sVar89 < 0x100) * cVar88 - (0xff < sVar89),
                                    uVar60)) >> 0x18);
      auVar27._0_10_ = (unkuint10)uVar53 << 0x38;
      auVar54._7_8_ = 0;
      auVar54._0_7_ =
           (uint7)(CONCAT62(auVar27._9_6_,
                            CONCAT11((0 < sVar84) * (sVar84 < 0x100) * cVar87 - (0xff < sVar84),
                                     cVar5)) >> 8);
      auVar65._1_8_ = SUB158(auVar54 << 0x40,7);
      auVar65[0] = cVar105;
      auVar65._9_6_ = 0;
      auVar33[4] = cVar104;
      auVar33._0_4_ = uVar102;
      auVar33._5_10_ = SUB1510(auVar65 << 0x30,5);
      auVar55._11_4_ = 0;
      auVar55._0_11_ = auVar33._4_11_;
      auVar39[2] = cVar103;
      auVar39._0_2_ = uVar83;
      auVar39._3_12_ = SUB1512(auVar55 << 0x20,3);
      auVar90[0xd] = 0;
      auVar90._0_13_ = auVar39._2_13_;
      uVar81 = uVar80 + 4;
      uVar79 = uVar80 + 8;
      uVar80 = uVar81;
    } while (uVar79 <= (uint)num_pixels);
  }
  iVar78 = num_pixels - (int)uVar81;
  if (iVar78 == 0) {
    return;
  }
  uVar81 = uVar81 & 0xffffffff;
  (*VP8LPredictorsAdd_C[0xc])(in + uVar81,upper + uVar81,iVar78,out + uVar81);
  return;
}

Assistant:

static void PredictorAdd12_SSE2(const uint32_t* in, const uint32_t* upper,
                                int num_pixels, uint32_t* WEBP_RESTRICT out) {
  int i;
  const __m128i zero = _mm_setzero_si128();
  const __m128i L8 = _mm_cvtsi32_si128((int)out[-1]);
  __m128i L = _mm_unpacklo_epi8(L8, zero);
  for (i = 0; i + 4 <= num_pixels; i += 4) {
    // Load 4 pixels at a time.
    __m128i src = _mm_loadu_si128((const __m128i*)&in[i]);
    const __m128i T = _mm_loadu_si128((const __m128i*)&upper[i]);
    const __m128i T_lo = _mm_unpacklo_epi8(T, zero);
    const __m128i T_hi = _mm_unpackhi_epi8(T, zero);
    const __m128i TL = _mm_loadu_si128((const __m128i*)&upper[i - 1]);
    const __m128i TL_lo = _mm_unpacklo_epi8(TL, zero);
    const __m128i TL_hi = _mm_unpackhi_epi8(TL, zero);
    __m128i diff_lo = _mm_sub_epi16(T_lo, TL_lo);
    __m128i diff_hi = _mm_sub_epi16(T_hi, TL_hi);
    DO_PRED12(diff_lo, 0, 0);
    DO_PRED12_SHIFT(diff_lo, 0);
    DO_PRED12(diff_lo, 1, 1);
    DO_PRED12_SHIFT(diff_lo, 1);
    DO_PRED12(diff_hi, 0, 2);
    DO_PRED12_SHIFT(diff_hi, 0);
    DO_PRED12(diff_hi, 1, 3);
  }
  if (i != num_pixels) {
    VP8LPredictorsAdd_C[12](in + i, upper + i, num_pixels - i, out + i);
  }
}